

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O3

vector<OpTpl_*,_std::allocator<OpTpl_*>_> * __thiscall
PcodeCompile::createStore(PcodeCompile *this,StarQuality *qual,ExprTree *ptr,ExprTree *val)

{
  vector<OpTpl*,std::allocator<OpTpl*>> *this_00;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvVar1;
  pointer ppOVar2;
  iterator __position;
  OpTpl *this_01;
  VarnodeTpl *pVVar3;
  OpTpl *op;
  OpTpl *local_78;
  ConstTpl local_70;
  ConstTpl local_50;
  
  this_00 = (vector<OpTpl*,std::allocator<OpTpl*>> *)ptr->ops;
  ptr->ops = (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)0x0;
  std::vector<OpTpl*,std::allocator<OpTpl*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<OpTpl**,std::vector<OpTpl*,std::allocator<OpTpl*>>>>
            (this_00,*(undefined8 *)(this_00 + 8),
             (val->ops->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (val->ops->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  pvVar1 = val->ops;
  ppOVar2 = (pvVar1->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((pvVar1->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppOVar2) {
    (pvVar1->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.super__Vector_impl_data.
    _M_finish = ppOVar2;
  }
  this_01 = (OpTpl *)operator_new(0x28);
  (this_01->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01->opc = CPUI_STORE;
  this_01->output = (VarnodeTpl *)0x0;
  local_78 = this_01;
  pVVar3 = (VarnodeTpl *)operator_new(0x68);
  ConstTpl::ConstTpl(&local_70,this->constantspace);
  ConstTpl::ConstTpl(&local_50,real,8);
  VarnodeTpl::VarnodeTpl(pVVar3,&local_70,&qual->id,&local_50);
  OpTpl::addInput(this_01,pVVar3);
  OpTpl::addInput(this_01,ptr->outvn);
  OpTpl::addInput(this_01,val->outvn);
  __position._M_current = *(OpTpl ***)(this_00 + 8);
  if (__position._M_current == *(OpTpl ***)(this_00 + 0x10)) {
    std::vector<OpTpl*,std::allocator<OpTpl*>>::_M_realloc_insert<OpTpl*const&>
              (this_00,__position,&local_78);
  }
  else {
    *__position._M_current = this_01;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  pVVar3 = val->outvn;
  ConstTpl::ConstTpl(&local_70,real,(ulong)qual->size);
  force_size(pVVar3,&local_70,(vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)this_00);
  ptr->outvn = (VarnodeTpl *)0x0;
  val->outvn = (VarnodeTpl *)0x0;
  ExprTree::~ExprTree(ptr);
  operator_delete(ptr);
  ExprTree::~ExprTree(val);
  operator_delete(val);
  operator_delete(qual);
  return (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)this_00;
}

Assistant:

vector<OpTpl *> *PcodeCompile::createStore(StarQuality *qual,
					      ExprTree *ptr,ExprTree *val)
{
  vector<OpTpl *> *res = ptr->ops;
  ptr->ops = (vector<OpTpl *> *)0;
  res->insert(res->end(),val->ops->begin(),val->ops->end());
  val->ops->clear();
  OpTpl *op = new OpTpl(CPUI_STORE);
  // The first varnode input to the store is a constant reference to the AddrSpace being loaded
  // from.  Internally, we really store the pointer to the AddrSpace as the reference, but this
  // isn't platform independent. So officially, we assume that the constant reference will be the
  // AddrSpace index.  We can safely assume this always has size 4.
  VarnodeTpl *spcvn = new VarnodeTpl(ConstTpl(constantspace),
				     qual->id,
				     ConstTpl(ConstTpl::real,8));
  op->addInput(spcvn);
  op->addInput(ptr->outvn);
  op->addInput(val->outvn);
  res->push_back(op);
  force_size(val->outvn,ConstTpl(ConstTpl::real,qual->size),*res);
  ptr->outvn = (VarnodeTpl *)0;
  val->outvn = (VarnodeTpl *)0;
  delete ptr;
  delete val;
  delete qual;
  return res;
}